

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::Dispatch_Engine
          (Dispatch_Engine *this,ChaiScript_Parser_Base *parser)

{
  ChaiScript_Parser_Base *parser_local;
  Dispatch_Engine *this_local;
  
  Catch::clara::std::shared_mutex::shared_mutex(&this->m_mutex);
  Type_Conversions::Type_Conversions(&this->m_conversions);
  memset(&this->m_stack_holder,0,8);
  std::reference_wrapper<chaiscript::parser::ChaiScript_Parser_Base>::
  reference_wrapper<chaiscript::parser::ChaiScript_Parser_Base&,void,chaiscript::parser::ChaiScript_Parser_Base*>
            ((reference_wrapper<chaiscript::parser::ChaiScript_Parser_Base> *)&this->m_parser,parser
            );
  Catch::clara::std::atomic<unsigned_long>::atomic(&this->m_method_missing_loc,0);
  State::State(&this->m_state);
  return;
}

Assistant:

explicit Dispatch_Engine(chaiscript::parser::ChaiScript_Parser_Base &parser)
          : m_stack_holder()
          , m_parser(parser) {
      }